

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strcase.c
# Opt level: O0

int curl_strequal(char *first,char *second)

{
  bool local_21;
  char *second_local;
  char *first_local;
  
  if ((first == (char *)0x0) || (second == (char *)0x0)) {
    local_21 = first == (char *)0x0 && second == (char *)0x0;
    first_local._4_4_ = (uint)local_21;
  }
  else {
    first_local._4_4_ = casecompare(first,second);
  }
  return first_local._4_4_;
}

Assistant:

int curl_strequal(const char *first, const char *second)
{
  if(first && second)
    /* both pointers point to something then compare them */
    return casecompare(first, second);

  /* if both pointers are NULL then treat them as equal */
  return (NULL == first && NULL == second);
}